

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  char *__s2;
  uchar uVar2;
  time_t tVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  GREATEST_INIT();
  if (1 < argc) {
    iVar5 = 1;
    bVar4 = greatest_info.flags;
    uVar2 = greatest_info.verbosity;
    do {
      __s2 = argv[iVar5];
      if (*__s2 == '-') {
        bVar1 = __s2[1];
        switch(bVar1) {
        case 0x65:
          greatest_info.exact_name_match = '\x01';
          break;
        case 0x66:
          bVar4 = bVar4 | 1;
          greatest_info.flags = bVar4;
          break;
        case 0x67:
        case 0x69:
        case 0x6a:
        case 0x6b:
        case 0x6d:
        case 0x6e:
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x75:
        case 0x77:
switchD_001035f7_caseD_67:
          iVar5 = strncmp("--help",__s2,6);
          if (iVar5 == 0) {
switchD_001035f7_caseD_68:
            greatest_usage(*argv);
            exit(0);
          }
          uVar7 = bVar1 - 0x2d;
          if (uVar7 == 0) {
            uVar7 = (uint)(byte)__s2[2];
          }
          if (uVar7 != 0) {
            fprintf(_stdout,"Unknown argument \'%s\'\n",__s2);
LAB_0010373e:
            greatest_usage(*argv);
            exit(1);
          }
          goto LAB_0010368c;
        case 0x68:
          goto switchD_001035f7_caseD_68;
        case 0x6c:
          bVar4 = bVar4 | 2;
          greatest_info.flags = bVar4;
          break;
        case 0x73:
        case 0x74:
        case 0x78:
          iVar6 = iVar5 + 1;
          if (argc <= iVar6) goto LAB_0010373e;
          switch(bVar1) {
          case 0x73:
            greatest_info.suite_filter = argv[iVar6];
            iVar5 = iVar6;
            break;
          case 0x74:
            greatest_info.test_filter = argv[iVar6];
            iVar5 = iVar6;
            break;
          default:
            goto switchD_001035f7_caseD_67;
          case 0x76:
            goto switchD_001035f7_caseD_76;
          case 0x78:
            greatest_info.test_exclude = argv[iVar6];
            iVar5 = iVar6;
          }
          break;
        case 0x76:
switchD_001035f7_caseD_76:
          uVar2 = uVar2 + '\x01';
          greatest_info.verbosity = uVar2;
          break;
        default:
          if (bVar1 != 0x61) goto switchD_001035f7_caseD_67;
          bVar4 = bVar4 | 4;
          greatest_info.flags = bVar4;
        }
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < argc);
  }
LAB_0010368c:
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  tinf_init();
  greatest_run_suite(tinflate,"tinflate");
  greatest_run_suite(tinfzlib,"tinfzlib");
  greatest_run_suite(tinfgzip,"tinfgzip");
  GREATEST_PRINT_REPORT();
  return (int)(greatest_info.failed != 0);
}

Assistant:

int main(int argc, char *argv[])
{
	GREATEST_MAIN_BEGIN();

	srand(time(NULL));

	tinf_init();

	RUN_SUITE(tinflate);
	RUN_SUITE(tinfzlib);
	RUN_SUITE(tinfgzip);

	GREATEST_MAIN_END();
}